

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multistage_vector_quantization.cc
# Opt level: O2

bool __thiscall
sptk::MultistageVectorQuantization::Run
          (MultistageVectorQuantization *this,vector<double,_std::allocator<double>_> *input_vector,
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          *codebook_vectors,vector<int,_std::allocator<int>_> *codebook_indices,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer __src;
  double *pdVar1;
  bool bVar2;
  size_type __new_size;
  long lVar3;
  ulong uVar4;
  double *pdVar5;
  size_t __n;
  size_type __new_size_00;
  double *pdVar6;
  long lVar7;
  
  if (this->is_valid_ == true) {
    lVar7 = (long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    __new_size_00 = lVar7 >> 3;
    if (__new_size_00 == (long)this->num_order_ + 1U) {
      __new_size = ((long)(codebook_vectors->
                          super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(codebook_vectors->
                         super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x18;
      if (buffer == (Buffer *)0x0) {
        return false;
      }
      if (codebook_indices == (vector<int,_std::allocator<int>_> *)0x0) {
        return false;
      }
      if (__new_size != (long)this->num_stage_) {
        return false;
      }
      if ((long)(codebook_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(codebook_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2 != __new_size) {
        std::vector<int,_std::allocator<int>_>::resize(codebook_indices,__new_size);
      }
      this_00 = &buffer->quantization_error_;
      if ((long)(buffer->quantization_error_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->quantization_error_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start != lVar7) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size_00);
      }
      __src = (input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
      __n = (long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,__src,__n);
      }
      uVar4 = (ulong)(uint)this->num_stage_;
      lVar7 = 0;
      while( true ) {
        lVar3 = (long)(int)uVar4;
        if (lVar3 <= lVar7) {
          return lVar3 <= lVar7;
        }
        bVar2 = VectorQuantization::Run
                          (&this->vector_quantization_,this_00,
                           (codebook_vectors->
                           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + lVar7,
                           (codebook_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                           .super__Vector_impl_data._M_start + lVar7);
        if (!bVar2) break;
        uVar4 = (ulong)this->num_stage_;
        if (lVar7 < (long)(uVar4 - 1)) {
          pdVar1 = (buffer->quantization_error_).super__Vector_base<double,_std::allocator<double>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pdVar6 = *(double **)
                    (*(long *)&(codebook_vectors->
                               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[lVar7].
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data +
                    (long)(codebook_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar7] * 0x18);
          for (pdVar5 = (buffer->quantization_error_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start; pdVar5 != pdVar1; pdVar5 = pdVar5 + 1) {
            *pdVar5 = *pdVar5 - *pdVar6;
            pdVar6 = pdVar6 + 1;
          }
        }
        lVar7 = lVar7 + 1;
      }
      return lVar3 <= lVar7;
    }
  }
  return false;
}

Assistant:

bool MultistageVectorQuantization::Run(
    const std::vector<double>& input_vector,
    const std::vector<std::vector<std::vector<double> > >& codebook_vectors,
    std::vector<int>* codebook_indices,
    MultistageVectorQuantization::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ || input_vector.size() != static_cast<std::size_t>(length) ||
      codebook_vectors.size() != static_cast<std::size_t>(num_stage_) ||
      NULL == codebook_indices || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (codebook_indices->size() != static_cast<std::size_t>(num_stage_)) {
    codebook_indices->resize(num_stage_);
  }
  if (buffer->quantization_error_.size() != static_cast<std::size_t>(length)) {
    buffer->quantization_error_.resize(length);
  }

  // Initialize quantization error.
  std::copy(input_vector.begin(), input_vector.end(),
            buffer->quantization_error_.begin());

  for (int n(0); n < num_stage_; ++n) {
    if (!vector_quantization_.Run(buffer->quantization_error_,
                                  codebook_vectors[n],
                                  &((*codebook_indices)[n]))) {
      return false;
    }

    if (n < num_stage_ - 1) {
      std::transform(buffer->quantization_error_.begin(),
                     buffer->quantization_error_.end(),
                     codebook_vectors[n][(*codebook_indices)[n]].begin(),
                     buffer->quantization_error_.begin(),
                     [](double e, double c) { return e - c; });
    }
  }

  return true;
}